

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# args.cpp
# Opt level: O0

void dpfb::args::listPlugins<dpfb::FontRendererCreator>(void)

{
  int iVar1;
  char *pcVar2;
  FontRendererCreator *pFVar3;
  undefined4 extraout_var;
  FontRendererCreator *local_28;
  FontRendererCreator *p_1;
  size_t len;
  FontRendererCreator *p;
  size_t maxNameLen;
  
  p = (FontRendererCreator *)0x0;
  for (len = (size_t)FontRendererCreator::getFirst(); len != 0;
      len = (size_t)FontRendererCreator::getNext((FontRendererCreator *)len)) {
    pcVar2 = FontRendererCreator::getName((FontRendererCreator *)len);
    pFVar3 = (FontRendererCreator *)strlen(pcVar2);
    if (p < pFVar3) {
      p = pFVar3;
    }
  }
  for (local_28 = FontRendererCreator::getFirst(); local_28 != (FontRendererCreator *)0x0;
      local_28 = FontRendererCreator::getNext(local_28)) {
    pcVar2 = FontRendererCreator::getName(local_28);
    iVar1 = (*local_28->_vptr_FontRendererCreator[2])();
    printf("  %-*s  %s\n",(ulong)p & 0xffffffff,pcVar2,CONCAT44(extraout_var,iVar1));
  }
  printf("\n");
  return;
}

Assistant:

void listPlugins()
{
    std::size_t maxNameLen = 0;
    for (const auto* p = T::getFirst(); p; p = p->getNext()) {
        const auto len = std::strlen(p->getName());
        if (len > maxNameLen)
            maxNameLen = len;
    }

    for (const auto* p = T::getFirst(); p; p = p->getNext())
        std::printf(
            "  %-*s  %s\n",
            static_cast<int>(maxNameLen),
            p->getName(),
            p->getDescription());
    std::printf("\n");
}